

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

void lyd_wd_leaflist_cleanup(ly_set *set,unres_data *unres)

{
  lys_node *node;
  ulong uVar1;
  
  if ((ulong)set->number != 0) {
    uVar1 = 0;
    do {
      if (((ulong)(set->set).s[uVar1]->dsc & 0x100) == 0) {
        uVar1 = 0;
        do {
          node = (set->set).s[uVar1];
          if (((ulong)node->dsc & 0x100) != 0) {
            if (unres->store_diff == 0) {
              lyd_free_internal_r((lyd_node *)node,1);
            }
            else {
              unres_data_diff_new(unres,(lyd_node *)node,(lyd_node *)node->iffeature,0);
              lyd_unlink_internal((lyd_node *)(set->set).s[uVar1],1);
            }
          }
          uVar1 = uVar1 + 1;
        } while (uVar1 < set->number);
        return;
      }
      uVar1 = uVar1 + 1;
    } while (set->number != uVar1);
  }
  return;
}

Assistant:

static void
lyd_wd_leaflist_cleanup(struct ly_set *set, struct unres_data *unres)
{
    unsigned int i;

    assert(set);

    /* if there is an instance without the dflt flag, we have to
     * remove all instances with the flag - an instance could be
     * explicitely added, so the default leaflists were invalidated */
    for (i = 0; i < set->number; i++) {
        if (!set->set.d[i]->dflt) {
            break;
        }
    }
    if (i < set->number) {
        for (i = 0; i < set->number; i++) {
            if (set->set.d[i]->dflt) {
                /* remove this default instance */
                if (unres->store_diff) {
                    /* just move it to diff if is being generated */
                    unres_data_diff_new(unres, set->set.d[i], set->set.d[i]->parent, 0);
                    lyd_unlink(set->set.d[i]);
                } else {
                    lyd_free(set->set.d[i]);
                }
            }
        }
    }
}